

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_expire_latest(SessionHandle *data,long milli)

{
  long lVar1;
  long lVar2;
  long lVar3;
  timeval tVar4;
  timeval older;
  
  tVar4 = curlx_tvnow();
  lVar2 = (milli % 1000) * 1000;
  lVar3 = tVar4.tv_usec + lVar2;
  lVar2 = tVar4.tv_usec + -1000000 + lVar2;
  if (lVar3 < 1000000) {
    lVar2 = lVar3;
  }
  lVar1 = (data->state).expiretime.tv_sec;
  if ((lVar1 != 0) || ((data->state).expiretime.tv_usec != 0)) {
    tVar4.tv_sec = (ulong)(999999 < lVar3) + tVar4.tv_sec + milli / 1000;
    tVar4.tv_usec = lVar2;
    older.tv_usec = (data->state).expiretime.tv_usec;
    older.tv_sec = lVar1;
    lVar3 = curlx_tvdiff(tVar4,older);
    if (0 < lVar3) {
      return;
    }
  }
  Curl_expire(data,milli);
  return;
}

Assistant:

void Curl_expire_latest(struct SessionHandle *data, long milli)
{
  struct timeval *expire = &data->state.expiretime;

  struct timeval set;

  set = Curl_tvnow();
  set.tv_sec += milli / 1000;
  set.tv_usec += (milli % 1000) * 1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  if(expire->tv_sec || expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
         is. */
    long diff = curlx_tvdiff(set, *expire);
    if(diff > 0)
      /* the new expire time was later than the top time, so just skip this */
      return;
  }

  /* Just add the timeout like normal */
  Curl_expire(data, milli);
}